

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

real fasttext::distL2(real *x,real *y,int32_t d)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  auVar4 = ZEXT816(0) << 0x40;
  uVar3 = 0;
  while ((uint)(~(d >> 0x1f) & d) != uVar3) {
    pfVar1 = x + uVar3;
    pfVar2 = y + uVar3;
    uVar3 = uVar3 + 1;
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)(*pfVar1 - *pfVar2)),
                             ZEXT416((uint)(*pfVar1 - *pfVar2)));
  }
  return auVar4._0_4_;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}